

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void BrotliDecoderDestroyInstance(BrotliDecoderStateInternal *state)

{
  brotli_free_func p_Var1;
  void *pvVar2;
  void *opaque;
  brotli_free_func free_func;
  BrotliDecoderStateInternal *state_local;
  
  if (state != (BrotliDecoderStateInternal *)0x0) {
    p_Var1 = state->free_func;
    pvVar2 = state->memory_manager_opaque;
    BrotliDecoderStateCleanup(state);
    (*p_Var1)(pvVar2,state);
  }
  return;
}

Assistant:

void BrotliDecoderDestroyInstance(BrotliDecoderState* state) {
  if (!state) {
    return;
  } else {
    brotli_free_func free_func = state->free_func;
    void* opaque = state->memory_manager_opaque;
    BrotliDecoderStateCleanup(state);
    free_func(opaque, state);
  }
}